

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
          (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this)

{
  char *pcVar1;
  
  (this->super_basic_buffer<char>)._vptr_basic_buffer = (_func_int **)&PTR_grow_001aeda8;
  pcVar1 = (this->super_basic_buffer<char>).ptr_;
  if (pcVar1 != this->store_) {
    operator_delete(pcVar1,(this->super_basic_buffer<char>).capacity_);
  }
  operator_delete(this,0x218);
  return;
}

Assistant:

~basic_memory_buffer() { deallocate(); }